

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.cpp
# Opt level: O3

ASTElement * __thiscall ninx::parser::element::Assignment::clone_impl(Assignment *this)

{
  pointer pcVar1;
  Block *in_RAX;
  ASTElement *pAVar2;
  pointer *__ptr;
  Block *local_18;
  
  local_18 = in_RAX;
  pAVar2 = (ASTElement *)operator_new(0x40);
  ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&local_18);
  pAVar2->parent = (Block *)0x0;
  pAVar2->__output_block = (Block *)0x0;
  pAVar2->_vptr_ASTElement = (_func_int **)&PTR__Assignment_001502e8;
  pAVar2[1]._vptr_ASTElement = (_func_int **)&pAVar2[1].__output_block;
  pcVar1 = (this->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pAVar2 + 1),pcVar1,pcVar1 + (this->name)._M_string_length);
  pAVar2[2].parent = local_18;
  return pAVar2;
}

Assistant:

ninx::parser::element::ASTElement *ninx::parser::element::Assignment::clone_impl() {
    return new Assignment(this->name, this->value->clone<Expression>());
}